

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,variable_statement *s)

{
  gc_heap *h;
  bool bVar1;
  int iVar2;
  list *this_00;
  scope *psVar3;
  wstring *pwVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  wstring_view wVar5;
  wstring_view local_c0;
  string local_b0 [2];
  value local_90;
  undefined1 local_68 [8];
  value init_val;
  declaration *d;
  const_iterator __end2;
  const_iterator __begin2;
  list *__range2;
  variable_statement *s_local;
  impl *this_local;
  
  this_00 = variable_statement::l(s);
  __end2 = std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::begin(this_00);
  d = (declaration *)std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_mjs::declaration_*,_std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>_>
                                *)&d);
    if (!bVar1) {
      completion::completion(__return_storage_ptr__,(value *)value::undefined,normal);
      return __return_storage_ptr__;
    }
    init_val.field_1._24_8_ =
         __gnu_cxx::
         __normal_iterator<const_mjs::declaration_*,_std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>_>
         ::operator*(&__end2);
    psVar3 = gc_heap_ptr<mjs::interpreter::impl::scope>::operator->(&this->active_scope_);
    pwVar4 = declaration::id_abi_cxx11_((declaration *)init_val.field_1._24_8_);
    bVar1 = scope::has_property(psVar3,pwVar4);
    if (!bVar1) break;
    iVar2 = declaration::init((declaration *)init_val.field_1._24_8_,(EVP_PKEY_CTX *)pwVar4);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = declaration::init((declaration *)init_val.field_1._24_8_,(EVP_PKEY_CTX *)pwVar4);
      eval(&local_90,this,(expression *)CONCAT44(extraout_var_00,iVar2));
      get_value((value *)local_68,this,&local_90);
      value::~value(&local_90);
      psVar3 = gc_heap_ptr<mjs::interpreter::impl::scope>::operator->(&this->active_scope_);
      h = this->heap_;
      pwVar4 = declaration::id_abi_cxx11_((declaration *)init_val.field_1._24_8_);
      wVar5 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar4);
      local_c0 = wVar5;
      string::string(local_b0,h,&local_c0);
      scope::put_local(psVar3,local_b0,(value *)local_68);
      string::~string(local_b0);
      value::~value((value *)local_68);
    }
    __gnu_cxx::
    __normal_iterator<const_mjs::declaration_*,_std::vector<mjs::declaration,_std::allocator<mjs::declaration>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("active_scope_->has_property(d.id())",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                ,0x382,"completion mjs::interpreter::impl::operator()(const variable_statement &)");
}

Assistant:

completion operator()(const variable_statement& s) {
        for (const auto& d: s.l()) {
            assert(active_scope_->has_property(d.id()));
            if (d.init()) {
                // Evaulate in two steps to avoid using stale activation object pointer in case the evaulation forces a garbage collection
                auto init_val = get_value(eval(*d.init()));
                active_scope_->put_local(string{heap_, d.id()}, init_val);
            }
        }
        return completion{};
    }